

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v6::format_system_error(v6 *this,buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  string_view message_00;
  int iVar2;
  undefined4 in_register_00000014;
  buffer<char> *c;
  basic_string_view<char> format_str;
  char *system_message;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined **local_2d8 [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_2
  local_2c8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_2
  local_2c0;
  undefined1 local_2b8 [8];
  undefined **local_2b0;
  char *local_2a8;
  size_t local_2a0;
  ulong local_298;
  char local_290 [504];
  undefined1 local_98 [8];
  char *local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined ***local_78;
  undefined8 local_70;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_48;
  
  local_2b0 = &PTR_grow_00114b48;
  local_298 = 500;
  local_2a0 = 500;
  local_2a8 = local_290;
  uVar1 = local_2a0;
  while( true ) {
    local_2a0 = uVar1;
    local_300 = local_2a8;
    iVar2 = detail::safe_strerror((int)out,&local_300,local_2a0);
    if (iVar2 != 0x22) break;
    uVar1 = local_2a0 * 2;
    if (local_298 < uVar1) {
      (*(code *)*local_2b0)(&local_2b0,uVar1);
    }
  }
  if (iVar2 == 0) {
    local_68 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>_>,_char,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                *)&local_2f8;
    local_2e8 = local_300;
    local_2c8 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_2
                  *)(this + 0x10);
    local_78 = local_2d8;
    local_2d8[0] = &PTR_grow_00114cb8;
    local_90 = "{}: {}";
    local_88 = 6;
    local_80 = 0;
    local_70 = 0xcd;
    local_60 = 0;
    local_58 = 0;
    local_48 = 0;
    format_str.size_ = (size_t)local_98;
    format_str.data_ = (char *)0x6;
    local_2f8 = (char *)CONCAT44(in_register_00000014,error_code);
    local_2f0 = message.data_;
    local_2c0 = local_2c8;
    local_2b8 = (undefined1  [8])this;
    detail::
    parse_format_string<false,char,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>&>
              ((detail *)"{}: {}",format_str,local_68);
  }
  local_2b0 = &PTR_grow_00114b48;
  if (local_2a8 != local_290) {
    operator_delete(local_2a8);
  }
  if (iVar2 != 0) {
    message_00.size_ = (size_t)message.data_;
    message_00.data_ = (char *)CONCAT44(in_register_00000014,error_code);
    detail::format_error_code((buffer<char> *)this,(int)out,message_00);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(std::back_inserter(out), "{}: {}", message, system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }